

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

void tree_sitter_bash_external_scanner_destroy(void *payload)

{
  long *plVar1;
  long lVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  plVar1 = (long *)((long)payload + 8);
  uVar3 = (ulong)*(uint *)((long)payload + 0x10);
  if (*(uint *)((long)payload + 0x10) != 0) {
    lVar5 = 0x18;
    uVar4 = 0;
    do {
      if ((uint)uVar3 <= (uint)uVar4) {
        __assert_fail("(uint32_t)(i) < (&scanner->heredocs)->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                      ,0x4bb,"void tree_sitter_bash_external_scanner_destroy(void *)");
      }
      lVar2 = *plVar1;
      if (*(void **)(lVar2 + lVar5) != (void *)0x0) {
        free(*(void **)(lVar2 + lVar5));
        *(undefined8 *)(lVar5 + lVar2) = 0;
        ((undefined8 *)(lVar5 + lVar2))[1] = 0;
      }
      __ptr = *(void **)(lVar2 + -0x10 + lVar5);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)(lVar2 + lVar5 + -0x10) = 0;
        *(undefined8 *)(lVar2 + lVar5 + -8) = 0;
      }
      uVar4 = uVar4 + 1;
      uVar3 = (ulong)*(uint *)((long)payload + 0x10);
      lVar5 = lVar5 + 0x28;
    } while (uVar4 < uVar3);
  }
  if ((void *)*plVar1 != (void *)0x0) {
    free((void *)*plVar1);
    *plVar1 = 0;
    *(undefined8 *)((long)payload + 0x10) = 0;
  }
  free(payload);
  return;
}

Assistant:

void tree_sitter_bash_external_scanner_destroy(void *payload) {
    Scanner *scanner = (Scanner *)payload;
    for (size_t i = 0; i < scanner->heredocs.size; i++) {
        Heredoc *heredoc = array_get(&scanner->heredocs, i);
        array_delete(&heredoc->current_leading_word);
        array_delete(&heredoc->delimiter);
    }
    array_delete(&scanner->heredocs);
    free(scanner);
}